

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

cf_int_t cf_array_find(cf_array_t *self,cf_void_t *elm,cf_size_t size,cf_alg_equal_f cmp)

{
  cf_bool_t cVar1;
  ulong local_38;
  cf_size_t i;
  cf_alg_equal_f cmp_local;
  cf_size_t size_local;
  cf_void_t *elm_local;
  cf_array_t *self_local;
  
  if (self->elm_count != 0) {
    for (local_38 = 0; local_38 < self->elm_count; local_38 = local_38 + 1) {
      cVar1 = (*cmp)(elm,(cf_void_t *)((long)self->elm_start + self->elm_size * local_38));
      if (cVar1 != 0) {
        return (cf_int_t)local_38;
      }
    }
  }
  return 0x7fffffff;
}

Assistant:

cf_int_t cf_array_find(cf_array_t* self, cf_void_t* elm, cf_size_t size, cf_alg_equal_f cmp) {
    cf_size_t i;
    if (self->elm_count <= 0) {
        return CF_ARRAY_INVALID_INDEX;
    }
    for (i = 0; i < self->elm_count; i++) {
        if (cmp(elm, (cf_uint8_t*)self->elm_start + self->elm_size * i)) {
            return i;
        }
    }

    return CF_ARRAY_INVALID_INDEX;
}